

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O2

void __thiscall particleSamples::perform_particle_reconstruction(particleSamples *this)

{
  double *pdVar1;
  long lVar2;
  vector<particle_info,_std::allocator<particle_info>_> *pvVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  long lVar18;
  value_type *__x;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *pvVar19;
  uint uVar20;
  pointer ppvVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  
  if (this->particle_monval == 0x14d) {
    pvVar19 = this->reconst_list_1;
    ppvVar21 = (pvVar19->
               super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    for (uVar23 = 0; uVar24 = (ulong)uVar23,
        uVar24 < (ulong)((long)(pvVar19->
                               super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar21 >> 3);
        uVar23 = uVar23 + 1) {
      uVar22 = 0;
      while( true ) {
        lVar2 = *(long *)&(ppvVar21[uVar24]->
                          super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl
                          .super__Vector_impl_data;
        if ((ulong)(((long)*(pointer *)
                            ((long)&(ppvVar21[uVar24]->
                                    super__Vector_base<particle_info,_std::allocator<particle_info>_>
                                    )._M_impl.super__Vector_impl_data + 8) - lVar2) / 0x78) <=
            (ulong)uVar22) break;
        lVar18 = (ulong)uVar22 * 0x78;
        pdVar1 = (double *)(lVar2 + 0x18 + lVar18);
        dVar10 = *pdVar1;
        dVar11 = pdVar1[1];
        pdVar1 = (double *)(lVar2 + 0x28 + lVar18);
        dVar12 = *pdVar1;
        dVar13 = pdVar1[1];
        pdVar1 = (double *)(lVar2 + 0x38 + lVar18);
        dVar14 = *pdVar1;
        dVar15 = pdVar1[1];
        pdVar1 = (double *)(lVar2 + 0x48 + lVar18);
        dVar16 = *pdVar1;
        dVar17 = pdVar1[1];
        uVar20 = 0;
        while( true ) {
          pvVar3 = (this->reconst_list_2->
                   super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar24];
          lVar2 = *(long *)&(pvVar3->
                            super__Vector_base<particle_info,_std::allocator<particle_info>_>).
                            _M_impl.super__Vector_impl_data;
          if ((ulong)(((long)*(pointer *)
                              ((long)&(pvVar3->
                                      super__Vector_base<particle_info,_std::allocator<particle_info>_>
                                      )._M_impl.super__Vector_impl_data + 8) - lVar2) / 0x78) <=
              (ulong)uVar20) break;
          lVar18 = (ulong)uVar20 * 0x78;
          pdVar1 = (double *)(lVar2 + 0x18 + lVar18);
          dVar25 = *pdVar1 + dVar10;
          dVar27 = pdVar1[1] + dVar11;
          pdVar1 = (double *)(lVar2 + 0x28 + lVar18);
          dVar29 = *pdVar1 + dVar12;
          dVar30 = pdVar1[1] + dVar13;
          pdVar1 = (double *)(lVar2 + 0x38 + lVar18);
          dVar6 = *pdVar1;
          dVar7 = pdVar1[1];
          pdVar1 = (double *)(lVar2 + 0x48 + lVar18);
          dVar8 = *pdVar1;
          dVar9 = pdVar1[1];
          dVar4 = ((dVar30 * dVar30 - dVar25 * dVar25) - dVar27 * dVar27) - dVar29 * dVar29;
          if (dVar4 < 0.0) {
            dVar4 = sqrt(dVar4);
          }
          else {
            dVar4 = SQRT(dVar4);
          }
          if ((ABS(dVar4 + -1.019) < 0.00443) &&
             (dVar4 = dVar16 - dVar8, dVar5 = dVar17 - dVar9, dVar26 = dVar14 - dVar6,
             dVar28 = dVar15 - dVar7,
             SQRT(dVar4 * dVar4 + dVar28 * dVar28 + dVar5 * dVar5 + dVar26 * dVar26) < 0.01)) {
            __x = (value_type *)operator_new(0x78);
            __x->mass = 1.019;
            __x->px = dVar25;
            __x->py = dVar27;
            __x->pz = dVar29;
            __x->E = dVar30;
            __x->x = (dVar6 + dVar14) * 0.5;
            __x->y = (dVar7 + dVar15) * 0.5;
            __x->z = (dVar8 + dVar16) * 0.5;
            __x->t = (dVar9 + dVar17) * 0.5;
            std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                      ((this->particle_list->
                       super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                       )._M_impl.super__Vector_impl_data._M_start[uVar24],__x);
          }
          uVar20 = uVar20 + 1;
        }
        uVar22 = uVar22 + 1;
        pvVar19 = this->reconst_list_1;
        ppvVar21 = (pvVar19->
                   super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
      }
    }
  }
  return;
}

Assistant:

void particleSamples::perform_particle_reconstruction() {
    if (particle_monval == 333) {
        // particle of interest is phi(1020)
        double particle_mass = 1.019;
        double particle_width = 0.00443;

        // now we loop over events
        for (unsigned int iev = 0; iev < reconst_list_1->size(); iev++) {
            // we first perfrom the (K^+, K^-) pair
            for (unsigned int i = 0; i < (*reconst_list_1)[iev]->size(); i++) {
                double E_1 = (*(*reconst_list_1)[iev])[i].E;
                double px_1 = (*(*reconst_list_1)[iev])[i].px;
                double py_1 = (*(*reconst_list_1)[iev])[i].py;
                double pz_1 = (*(*reconst_list_1)[iev])[i].pz;
                double t_1 = (*(*reconst_list_1)[iev])[i].t;
                double x_1 = (*(*reconst_list_1)[iev])[i].x;
                double y_1 = (*(*reconst_list_1)[iev])[i].y;
                double z_1 = (*(*reconst_list_1)[iev])[i].z;
                for (unsigned int j = 0; j < (*reconst_list_2)[iev]->size();
                     j++) {
                    double E_2 = (*(*reconst_list_2)[iev])[j].E;
                    double px_2 = (*(*reconst_list_2)[iev])[j].px;
                    double py_2 = (*(*reconst_list_2)[iev])[j].py;
                    double pz_2 = (*(*reconst_list_2)[iev])[j].pz;
                    double t_2 = (*(*reconst_list_2)[iev])[j].t;
                    double x_2 = (*(*reconst_list_2)[iev])[j].x;
                    double y_2 = (*(*reconst_list_2)[iev])[j].y;
                    double z_2 = (*(*reconst_list_2)[iev])[j].z;

                    // compute the invariant mass
                    double E = E_1 + E_2;
                    double px = px_1 + px_2;
                    double py = py_1 + py_2;
                    double pz = pz_1 + pz_2;
                    double invariant_mass =
                        sqrt(E * E - px * px - py * py - pz * pz);
                    if (std::abs(invariant_mass - particle_mass)
                        < particle_width) {
                        // phi(1020) resonance found
                        double spatial_distance = sqrt(
                            (t_1 - t_2) * (t_1 - t_2)
                            + (x_1 - x_2) * (x_1 - x_2)
                            + (y_1 - y_2) * (y_1 - y_2)
                            + (z_1 - z_2) * (z_1 - z_2));
                        if (spatial_distance < 0.01) {
                            // this is a real phi(1020)
                            particle_info *mother = new particle_info;
                            mother->mass = particle_mass;
                            mother->E = E;
                            mother->px = px;
                            mother->py = py;
                            mother->pz = pz;
                            mother->t = (t_1 + t_2) / 2.;
                            mother->x = (x_1 + x_2) / 2.;
                            mother->y = (y_1 + y_2) / 2.;
                            mother->z = (z_1 + z_2) / 2.;
                            (*particle_list)[iev]->push_back(*mother);
                        }
                    }
                }
            }
        }
    }
}